

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

bool ot::commissioner::coap::Message::IsCriticalOption(OptionType aNumber)

{
  ushort uVar1;
  
  uVar1 = (ushort)(aNumber - kIfMatch) >> 1;
  return (bool)((byte)(0xa01af >> ((byte)uVar1 & 0x1f)) &
               (ushort)(uVar1 | (ushort)((aNumber - kIfMatch & 1) != 0) << 0xf) < 0x14);
}

Assistant:

bool Message::IsCriticalOption(OptionType aNumber)
{
    switch (aNumber)
    {
    case OptionType::kIfMatch:
    case OptionType::kUriHost:
    case OptionType::kIfNonMatch:
    case OptionType::kUriPort:
    case OptionType::kUriPath:
    case OptionType::kUriQuery:
    case OptionType::kAccept:
    case OptionType::kProxyUri:
    case OptionType::kProxyScheme:
        return true;
    default:
        return false;
    }
}